

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::words(Forth *this)

{
  anon_class_16_2_d92de223 __f;
  WriteTarget param;
  WriteTarget local_14;
  reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
  local_10;
  reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
  local_8;
  
  local_14 = this->writeToTarget;
  local_8.current._M_current =
       (__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>
        )(this->definitions).
         super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  local_10.current._M_current =
       (__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>
        )(this->definitions).
         super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
         ._M_impl.super__Vector_impl_data._M_start;
  __f.param = &local_14;
  __f.buf = &this->std_cout;
  std::
  for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition*,std::vector<cppforth::Forth::Definition,std::allocator<cppforth::Forth::Definition>>>>,cppforth::Forth::words()::_lambda(cppforth::Forth::Definition&)_1_>
            (&local_8,&local_10,__f);
  return;
}

Assistant:

void words() {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			std::stringstream &buf = std_cout;
			auto param = writeToTarget;
			std::for_each(definitions.rbegin(), definitions.rend(), [&buf,&param](Definition& defn) {
				if (defn.isFindable()) {
					switch (param) {
					case ToString:
						buf << defn.name << " ";
						break;
					case ToStdCout:
						std::cout << defn.name << " ";
						std::cout.flush();
						break;
					default:
						break;
					}
				}
			});
#endif
		}